

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationtailoring.cpp
# Opt level: O0

void __thiscall
icu_63::CollationTailoring::setVersion
          (CollationTailoring *this,uint8_t *baseVersion,uint8_t *rulesVersion)

{
  uint8_t *rulesVersion_local;
  uint8_t *baseVersion_local;
  CollationTailoring *this_local;
  
  this->version[0] = '\t';
  this->version[1] = baseVersion[1];
  this->version[2] =
       (baseVersion[2] & 0xc0) + (*rulesVersion + (char)((int)(uint)*rulesVersion >> 6) & 0x3f);
  this->version[3] =
       rulesVersion[1] * '\b' + (char)((int)(uint)rulesVersion[1] >> 5) + rulesVersion[2] +
       rulesVersion[3] * '\x10' + (char)((int)(uint)rulesVersion[3] >> 4);
  return;
}

Assistant:

void
CollationTailoring::setVersion(const UVersionInfo baseVersion, const UVersionInfo rulesVersion) {
    version[0] = UCOL_BUILDER_VERSION;
    version[1] = baseVersion[1];
    version[2] = (baseVersion[2] & 0xc0) + ((rulesVersion[0] + (rulesVersion[0] >> 6)) & 0x3f);
    version[3] = (rulesVersion[1] << 3) + (rulesVersion[1] >> 5) + rulesVersion[2] +
            (rulesVersion[3] << 4) + (rulesVersion[3] >> 4);
}